

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

char __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_chars<3ul>
          (parser_t<comments_skipper_t> *this,char (*expected) [3])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  size_type *psVar8;
  char ch;
  char extraout_DL;
  size_type extraout_RDX;
  size_type sVar9;
  string list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if ((*expected)[2] != '\0') {
    __assert_fail("expected[N - 1] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/include/loltoml/detail/parser.hpp"
                  ,0x6e,
                  "char loltoml::detail::parser_t<comments_skipper_t>::parse_chars(const char (&)[N]) [Handler = comments_skipper_t, N = 3UL]"
                 );
  }
  cVar4 = input_stream_t::get(&this->input);
  if ((cVar4 != (*expected)[0]) && (cVar4 != (*expected)[1])) {
    escape_char_abi_cxx11_(&local_a8,(detail *)(ulong)(uint)(int)(*expected)[0],ch);
    std::operator+(&local_c8,"\'",&local_a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_68._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_68._M_dataplus._M_p == psVar8) {
      local_68.field_2._M_allocated_capacity = *psVar8;
      local_68.field_2._8_8_ = plVar5[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar8;
    }
    sVar9 = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    paVar1 = &local_c8.field_2;
    local_68._M_string_length = sVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
      sVar9 = extraout_RDX;
    }
    cVar4 = (char)sVar9;
    paVar2 = &local_a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p);
      cVar4 = extraout_DL;
    }
    escape_char_abi_cxx11_(&local_48,(detail *)(ulong)(uint)(int)(*expected)[1],cVar4);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x18c8c5);
    local_a8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_a8._M_dataplus._M_p == psVar8) {
      local_a8.field_2._M_allocated_capacity = *psVar8;
      local_a8.field_2._8_8_ = plVar5[3];
      local_a8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar8;
    }
    local_a8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_c8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_c8._M_dataplus._M_p == psVar8) {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8.field_2._8_8_ = plVar5[3];
      local_c8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar8;
    }
    local_c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::operator+(&local_88,"Expected one of the following symbols: ",&local_68);
    sVar3 = (this->input).m_processed;
    lVar7 = 0;
    if (sVar3 != 0) {
      lVar7 = sVar3 - 1;
    }
    *puVar6 = &PTR__parser_error_t_001af398;
    puVar6[1] = puVar6 + 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      *(undefined4 *)(puVar6 + 3) = local_88.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)puVar6 + 0x1c) = local_88.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(puVar6 + 4) = local_88.field_2._8_4_;
      *(undefined4 *)((long)puVar6 + 0x24) = local_88.field_2._12_4_;
    }
    else {
      puVar6[1] = local_88._M_dataplus._M_p;
      puVar6[3] = CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                           local_88.field_2._M_allocated_capacity._0_4_);
    }
    puVar6[2] = local_88._M_string_length;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity._0_4_ =
         local_88.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    puVar6[5] = lVar7;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  }
  return cVar4;
}

Assistant:

char parse_chars(const char (&expected)[N]) {
        static_assert(N > 0, "No expected characters specified");
        assert(expected[N - 1] == '\0');

        char result = input.get();
        for (std::size_t i = 0; i + 1 < N; ++i) {
            if (result == expected[i]) {
                return result;
            }
        }

        std::string list = "\'" + escape_char(expected[0]) + "\'";

        for (std::size_t i = 1; i + 1 < N; ++i) {
            list += ", \'" + escape_char(expected[i]) + "\'";
        }

        throw parser_error_t("Expected one of the following symbols: " + list, last_char_offset());
    }